

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
          (list<int,ft::allocator<int>> *this,constListIterator<int> *first,
          constListIterator<int> *last,type *param_3)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  Node *pNVar4;
  
  list<int,_ft::allocator<int>_>::clear((list<int,_ft::allocator<int>_> *)this);
  pNVar4 = (first->super_listIterator<int>).m_node;
  while (pNVar4 != (last->super_listIterator<int>).m_node) {
    piVar3 = (int *)operator_new(0x18);
    *piVar3 = pNVar4->data;
    lVar1 = *(long *)(this + 8);
    lVar2 = *(long *)(lVar1 + 8);
    *(long *)(piVar3 + 2) = lVar2;
    *(int **)(lVar2 + 0x10) = piVar3;
    *(long *)(piVar3 + 4) = lVar1;
    *(int **)(lVar1 + 8) = piVar3;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    pNVar4 = ((first->super_listIterator<int>).m_node)->next;
    (first->super_listIterator<int>).m_node = pNVar4;
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();
		while (first != last) {
			this->push_back(*first);
			++first;
		}
	}